

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::NullTypeHandlerBase::FreezeImpl
          (NullTypeHandlerBase *this,DynamicObject *instance,bool isConvertedType)

{
  int *piVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar3;
  
  pDVar3 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>(this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertNullToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (pDVar3->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[99];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pDVar3,instance,1,UNRECOVERED_JUMPTABLE);
  return iVar2;
}

Assistant:

BOOL NullTypeHandlerBase::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
        return ConvertToDictionaryType(instance)->Freeze(instance, true);
    }